

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O1

void __thiscall
flatbuffers::vector_downward<unsigned_int>::fill_big
          (vector_downward<unsigned_int> *this,size_t zero_pad_bytes)

{
  if (zero_pad_bytes != 0) {
    ensure_space(this,zero_pad_bytes);
    this->cur_ = this->cur_ + -zero_pad_bytes;
    this->size_ = this->size_ + (int)zero_pad_bytes;
  }
  memset(this->cur_,0,zero_pad_bytes);
  return;
}

Assistant:

void fill_big(size_t zero_pad_bytes) {
    memset(make_space(zero_pad_bytes), 0, zero_pad_bytes);
  }